

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar * base64_encode(uchar *str,int str_len)

{
  int iVar1;
  uchar *puVar2;
  uchar *base64_table;
  int j;
  int i;
  uchar *res;
  long len;
  int str_len_local;
  uchar *str_local;
  
  if (str_len % 3 == 0) {
    iVar1 = str_len / 3 << 2;
  }
  else {
    iVar1 = (str_len / 3 + 1) * 4;
  }
  res = (uchar *)(long)iVar1;
  puVar2 = (uchar *)malloc((size_t)(res + 1));
  puVar2[(long)res] = '\0';
  base64_table._0_4_ = 0;
  for (base64_table._4_4_ = 0; (long)base64_table._4_4_ < (long)(res + -2);
      base64_table._4_4_ = base64_table._4_4_ + 4) {
    puVar2[base64_table._4_4_] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(int)(uint)str[(int)base64_table] >> 2];
    puVar2[base64_table._4_4_ + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(int)((str[(int)base64_table] & 3) << 4 | (int)(uint)str[(int)base64_table + 1] >> 4)];
    puVar2[base64_table._4_4_ + 2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(int)((str[(int)base64_table + 1] & 0xf) << 2 | (int)(uint)str[(int)base64_table + 2] >> 6
               )];
    puVar2[base64_table._4_4_ + 3] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(int)(str[(int)base64_table + 2] & 0x3f)];
    base64_table._0_4_ = (int)base64_table + 3;
  }
  if (str_len % 3 == 1) {
    puVar2[base64_table._4_4_ + -2] = '=';
    puVar2[base64_table._4_4_ + -1] = '=';
  }
  else if (str_len % 3 == 2) {
    puVar2[base64_table._4_4_ + -1] = '=';
  }
  return puVar2;
}

Assistant:

unsigned char *base64_encode(unsigned char *str,int str_len) {
    long len;
    unsigned char *res;
    int i, j;
//定义base64编码表
    unsigned char *base64_table = (unsigned char *) "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

//计算经过base64编码后的字符串长度
    if (str_len % 3 == 0)
        len = str_len / 3 * 4;
    else
        len = (str_len / 3 + 1) * 4;

    res = static_cast<unsigned char *>(malloc(sizeof(unsigned char) * len + 1));
    res[len] = '\0';

//以3个8位字符为一组进行编码
    for (i = 0, j = 0; i < len - 2; j += 3, i += 4) {
        res[i] = base64_table[str[j] >> 2]; //取出第一个字符的前6位并找出对应的结果字符
        res[i + 1] = base64_table[(str[j] & 0x3) << 4 | (str[j + 1] >> 4)]; //将第一个字符的后位与第二个字符的前4位进行组合并找到对应的结果字符
        res[i + 2] = base64_table[(str[j + 1] & 0xf) << 2 | (str[j + 2] >> 6)]; //将第二个字符的后4位与第三个字符的前2位组合并找出对应的结果字符
        res[i + 3] = base64_table[str[j + 2] & 0x3f]; //取出第三个字符的后6位并找出结果字符
    }

    switch (str_len % 3) {
        case 1:
            res[i - 2] = '=';
            res[i - 1] = '=';
            break;
        case 2:
            res[i - 1] = '=';
            break;
    }

    return res;
}